

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable_partition_suite.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  
  partition_null();
  partition_boolean();
  partition_integer();
  partition_real();
  partition_string();
  partition_array();
  partition_map_value();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    partition_null();
    partition_boolean();
    partition_integer();
    partition_real();
    partition_string();
    partition_array();
    partition_map_value();

    return boost::report_errors();
}